

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

void S_NoiseDebug(void)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  sfxinfo_t *psVar4;
  float extraout_XMM0_Da;
  char *local_128;
  char *local_118;
  char *local_108;
  char *local_f8;
  char *local_e8;
  char *local_d8;
  char *local_c8;
  char *local_b8;
  char *local_a8;
  TVector3<float> local_84;
  char local_78 [8];
  char temp [32];
  int local_44;
  int color;
  int y;
  FVector3 origin;
  FVector3 listener;
  FSoundChan *chan;
  
  TVector3<float>::TVector3((TVector3<float> *)&origin.Y);
  TVector3<float>::TVector3((TVector3<float> *)&color);
  local_44 = CleanYfac * 0x20;
  DCanvas::DrawText((DCanvas *)screen,SmallFont,10,0,local_44,"*** SOUND DEBUG INFO ***",0);
  iVar1 = local_44 + 8;
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0,iVar1,"name",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x46,iVar1,"x",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x78,iVar1,"y",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0xaa,iVar1,"z",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0xdc,iVar1,"vol",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x104,iVar1,"dist",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,300,iVar1,"chan",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x154,iVar1,"pri",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x17c,iVar1,"flags",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x1cc,iVar1,"aud",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x208,iVar1,"pos",0);
  local_44 = local_44 + 0x10;
  if (Channels != (FSoundChan *)0x0) {
    TObjPtr<AActor>::operator->((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
    AActor::SoundPos((AActor *)(temp + 0x1c));
    TVector3<float>::operator=((TVector3<float> *)&origin.Y,(TVector3<float> *)(temp + 0x1c));
    for (listener._4_8_ = Channels; *(long *)(listener._4_8_ + 0x28) != 0;
        listener._4_8_ = *(undefined8 *)(listener._4_8_ + 0x28)) {
    }
    while (iVar1 = DCanvas::GetHeight((DCanvas *)screen), local_44 < iVar1 + -0x10) {
      CalcPosVel((FSoundChan *)listener._4_8_,(FVector3 *)&color,(FVector3 *)0x0);
      iVar1 = 2;
      if ((*(uint *)(listener._4_8_ + 0x44) & 0x100) != 0) {
        iVar1 = 4;
      }
      iVar2 = FSoundID::operator_cast_to_int((FSoundID *)(listener._4_8_ + 0x38));
      psVar4 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(long)iVar2);
      FWadCollection::GetLumpName(&Wads,local_78,psVar4->lumpnum);
      temp[0] = '\0';
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar1,0,local_44,local_78,0);
      if ((*(uint *)(listener._4_8_ + 0x44) & 1) == 0) {
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar1,0x46,local_44,"---",0);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar1,0x78,local_44,"---",0);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar1,0xaa,local_44,"---",0);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar1,0x104,local_44,"---",0);
      }
      else {
        mysnprintf(local_78,0x20,"%.0f",(double)(float)color);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar1,0x46,local_44,local_78,0);
        mysnprintf(local_78,0x20,"%.0f",(double)origin.X);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar1,0x78,local_44,local_78,0);
        mysnprintf(local_78,0x20,"%.0f",(double)(float)y);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar1,0xaa,local_44,local_78,0);
        if (*(float *)(listener._4_8_ + 0x1c) <= 0.0) {
          DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar1,0x104,local_44,"---",0);
        }
        else {
          TVector3<float>::operator-(&local_84,(TVector3<float> *)&color);
          TVector3<float>::Length(&local_84);
          mysnprintf(local_78,0x20,"%.0f");
          DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar1,0x104,local_44,local_78,0);
        }
      }
      mysnprintf(local_78,0x20,"%.2g",(double)*(float *)(listener._4_8_ + 0x40));
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar1,0xdc,local_44,local_78,0);
      mysnprintf(local_78,0x20,"%d",(ulong)*(byte *)(listener._4_8_ + 0x4a));
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar1,300,local_44,local_78,0);
      mysnprintf(local_78,0x20,"%d",(ulong)(uint)(int)*(char *)(listener._4_8_ + 0x4b));
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar1,0x154,local_44,local_78,0);
      if ((*(uint *)(listener._4_8_ + 0x44) & 1) == 0) {
        local_a8 = "\x1cM";
      }
      else {
        local_a8 = "\x1cD";
      }
      if ((*(uint *)(listener._4_8_ + 0x44) & 8) == 0) {
        local_b8 = "\x1cM";
      }
      else {
        local_b8 = "\x1cD";
      }
      if ((*(uint *)(listener._4_8_ + 0x44) & 0x20) == 0) {
        local_c8 = "\x1cM";
      }
      else {
        local_c8 = "\x1cD";
      }
      if ((*(uint *)(listener._4_8_ + 0x44) & 0x10) == 0) {
        local_d8 = "\x1cM";
      }
      else {
        local_d8 = "\x1cD";
      }
      if ((*(uint *)(listener._4_8_ + 0x44) & 0x40) == 0) {
        local_e8 = "\x1cM";
      }
      else {
        local_e8 = "\x1cD";
      }
      if ((*(uint *)(listener._4_8_ + 0x44) & 0x80) == 0) {
        local_f8 = "\x1cM";
      }
      else {
        local_f8 = "\x1cD";
      }
      if ((*(uint *)(listener._4_8_ + 0x44) & 0x100) == 0) {
        local_108 = "\x1cM";
      }
      else {
        local_108 = "\x1cD";
      }
      if ((*(uint *)(listener._4_8_ + 0x44) & 2) == 0) {
        local_118 = "\x1cM";
      }
      else {
        local_118 = "\x1cD";
      }
      if ((*(uint *)(listener._4_8_ + 0x44) & 0x800) == 0) {
        local_128 = "\x1cM";
      }
      else {
        local_128 = "\x1cD";
      }
      mysnprintf(local_78,0x20,"%s3%sZ%sU%sM%sN%sA%sL%sE%sV",local_a8,local_b8,local_c8,local_d8,
                 local_e8,local_f8,local_108,local_118,local_128);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar1,0x17c,local_44,local_78,0);
      (*GSnd->_vptr_SoundRenderer[0x14])(GSnd,listener._4_8_);
      mysnprintf(local_78,0x20,"%.4f",(double)extraout_XMM0_Da);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar1,0x1cc,local_44,local_78,0);
      uVar3 = (*GSnd->_vptr_SoundRenderer[0x13])(GSnd,listener._4_8_);
      mysnprintf(local_78,0x20,"%u",(ulong)uVar3);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar1,0x208,local_44,local_78,0);
      local_44 = local_44 + 8;
      if (*(FSoundChan ***)(listener._4_8_ + 0x30) == &Channels) break;
      listener._4_8_ = *(long *)(listener._4_8_ + 0x30) + -0x28;
    }
    V_SetBorderNeedRefresh();
  }
  return;
}

Assistant:

void S_NoiseDebug (void)
{
	FSoundChan *chan;
	FVector3 listener;
	FVector3 origin;
	int y, color;

	y = 32 * CleanYfac;
	screen->DrawText (SmallFont, CR_YELLOW, 0, y, "*** SOUND DEBUG INFO ***", TAG_DONE);
	y += 8;

	screen->DrawText (SmallFont, CR_GOLD, 0, y, "name", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 70, y, "x", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 120, y, "y", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 170, y, "z", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 220, y, "vol", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 260, y, "dist", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 300, y, "chan", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 340, y, "pri", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 380, y, "flags", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 460, y, "aud", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 520, y, "pos", TAG_DONE);
	y += 8;

	if (Channels == NULL)
	{
		return;
	}


	listener = players[consoleplayer].camera->SoundPos();

	// Display the oldest channel first.
	for (chan = Channels; chan->NextChan != NULL; chan = chan->NextChan)
	{ }
	while (y < SCREENHEIGHT - 16)
	{
		char temp[32];

		CalcPosVel(chan, &origin, NULL);
		color = (chan->ChanFlags & CHAN_LOOP) ? CR_BROWN : CR_GREY;

		// Name
		Wads.GetLumpName (temp, S_sfx[chan->SoundID].lumpnum);
		temp[8] = 0;
		screen->DrawText (SmallFont, color, 0, y, temp, TAG_DONE);

		if (!(chan->ChanFlags & CHAN_IS3D))
		{
			screen->DrawText(SmallFont, color, 70, y, "---", TAG_DONE);		// X
			screen->DrawText(SmallFont, color, 120, y, "---", TAG_DONE);	// Y
			screen->DrawText(SmallFont, color, 170, y, "---", TAG_DONE);	// Z
			screen->DrawText(SmallFont, color, 260, y, "---", TAG_DONE);	// Distance
		}
		else
		{
			// X coordinate
			mysnprintf(temp, countof(temp), "%.0f", origin.X);
			screen->DrawText(SmallFont, color, 70, y, temp, TAG_DONE);

			// Y coordinate
			mysnprintf(temp, countof(temp), "%.0f", origin.Z);
			screen->DrawText(SmallFont, color, 120, y, temp, TAG_DONE);

			// Z coordinate
			mysnprintf(temp, countof(temp), "%.0f", origin.Y);
			screen->DrawText(SmallFont, color, 170, y, temp, TAG_DONE);

			// Distance
			if (chan->DistanceScale > 0)
			{
				mysnprintf(temp, countof(temp), "%.0f", (origin - listener).Length());
				screen->DrawText(SmallFont, color, 260, y, temp, TAG_DONE);
			}
			else
			{
				screen->DrawText(SmallFont, color, 260, y, "---", TAG_DONE);
			}
		}

		// Volume
		mysnprintf(temp, countof(temp), "%.2g", chan->Volume);
		screen->DrawText(SmallFont, color, 220, y, temp, TAG_DONE);

		// Channel
		mysnprintf(temp, countof(temp), "%d", chan->EntChannel);
		screen->DrawText(SmallFont, color, 300, y, temp, TAG_DONE);

		// Priority
		mysnprintf(temp, countof(temp), "%d", chan->Priority);
		screen->DrawText(SmallFont, color, 340, y, temp, TAG_DONE);

		// Flags
		mysnprintf(temp, countof(temp), "%s3%sZ%sU%sM%sN%sA%sL%sE%sV",
			(chan->ChanFlags & CHAN_IS3D)			? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_LISTENERZ)		? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_UI)				? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_MAYBE_LOCAL)	? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_NOPAUSE)		? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_AREA)			? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_LOOP)			? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_EVICTED)		? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_VIRTUAL)		? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK);
		screen->DrawText(SmallFont, color, 380, y, temp, TAG_DONE);

		// Audibility
		mysnprintf(temp, countof(temp), "%.4f", GSnd->GetAudibility(chan));
		screen->DrawText(SmallFont, color, 460, y, temp, TAG_DONE);

		// Position
		mysnprintf(temp, countof(temp), "%u", GSnd->GetPosition(chan));
		screen->DrawText(SmallFont, color, 520, y, temp, TAG_DONE);


		y += 8;
		if (chan->PrevChan == &Channels)
		{
			break;
		}
		chan = (FSoundChan *)((size_t)chan->PrevChan - myoffsetof(FSoundChan, NextChan));
	}
	V_SetBorderNeedRefresh();
}